

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffwend(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  LONGLONG bytepos;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int tstatus;
  char keyrec [81];
  char endkey [81];
  char blankkey [81];
  int local_15c;
  long local_158;
  long local_150;
  char local_148 [96];
  char local_e8 [96];
  char local_88 [88];
  
  local_148[0x40] = '\0';
  local_148[0x41] = '\0';
  local_148[0x42] = '\0';
  local_148[0x43] = '\0';
  local_148[0x44] = '\0';
  local_148[0x45] = '\0';
  local_148[0x46] = '\0';
  local_148[0x47] = '\0';
  local_148[0x48] = '\0';
  local_148[0x49] = '\0';
  local_148[0x4a] = '\0';
  local_148[0x4b] = '\0';
  local_148[0x4c] = '\0';
  local_148[0x4d] = '\0';
  local_148[0x4e] = '\0';
  local_148[0x4f] = '\0';
  local_148[0x30] = '\0';
  local_148[0x31] = '\0';
  local_148[0x32] = '\0';
  local_148[0x33] = '\0';
  local_148[0x34] = '\0';
  local_148[0x35] = '\0';
  local_148[0x36] = '\0';
  local_148[0x37] = '\0';
  local_148[0x38] = '\0';
  local_148[0x39] = '\0';
  local_148[0x3a] = '\0';
  local_148[0x3b] = '\0';
  local_148[0x3c] = '\0';
  local_148[0x3d] = '\0';
  local_148[0x3e] = '\0';
  local_148[0x3f] = '\0';
  local_148[0x20] = '\0';
  local_148[0x21] = '\0';
  local_148[0x22] = '\0';
  local_148[0x23] = '\0';
  local_148[0x24] = '\0';
  local_148[0x25] = '\0';
  local_148[0x26] = '\0';
  local_148[0x27] = '\0';
  local_148[0x28] = '\0';
  local_148[0x29] = '\0';
  local_148[0x2a] = '\0';
  local_148[0x2b] = '\0';
  local_148[0x2c] = '\0';
  local_148[0x2d] = '\0';
  local_148[0x2e] = '\0';
  local_148[0x2f] = '\0';
  local_148[0x10] = '\0';
  local_148[0x11] = '\0';
  local_148[0x12] = '\0';
  local_148[0x13] = '\0';
  local_148[0x14] = '\0';
  local_148[0x15] = '\0';
  local_148[0x16] = '\0';
  local_148[0x17] = '\0';
  local_148[0x18] = '\0';
  local_148[0x19] = '\0';
  local_148[0x1a] = '\0';
  local_148[0x1b] = '\0';
  local_148[0x1c] = '\0';
  local_148[0x1d] = '\0';
  local_148[0x1e] = '\0';
  local_148[0x1f] = '\0';
  local_148[0] = '\0';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\0';
  local_148[6] = '\0';
  local_148[7] = '\0';
  local_148[8] = '\0';
  local_148[9] = '\0';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_148[0xc] = '\0';
  local_148[0xd] = '\0';
  local_148[0xe] = '\0';
  local_148[0xf] = '\0';
  local_148[0x50] = 0;
  if (0 < *status) {
    return *status;
  }
  pFVar1 = fptr->Fptr;
  lVar7 = pFVar1->headend;
  if (pFVar1->datastart == -1) {
    pFVar1->datastart = (lVar7 / 0xb40) * 0xb40 + 0xb40;
  }
  lVar5 = pFVar1->datastart - lVar7;
  lVar4 = lVar5 / 0x50;
  builtin_strncpy(local_88 + 0x20,"        ",9);
  builtin_strncpy(local_88 + 0x10,"                ",0x10);
  builtin_strncpy(local_88,"                ",0x10);
  sVar3 = strlen(local_88);
  builtin_strncpy(local_88 + sVar3,"                                        ",0x29);
  builtin_strncpy(local_e8,"END                                     ",0x29);
  sVar3 = strlen(local_e8);
  builtin_strncpy(local_e8 + sVar3,"                                        ",0x29);
  local_15c = 0;
  ffmbyt(fptr,lVar7,0,&local_15c);
  lVar6 = 0;
  local_150 = lVar5;
  if (0x4f < lVar5) {
    lVar5 = 0;
    local_158 = lVar7;
    while (ffgbyt(fptr,0x50,local_148,&local_15c), lVar7 = local_158, lVar6 = lVar5, local_15c == 0)
    {
      iVar2 = strncmp(local_148,local_88,0x50);
      if (((iVar2 != 0) && (iVar2 = strncmp(local_148,local_e8,0x50), lVar7 = local_158, iVar2 != 0)
          ) || (lVar5 = lVar5 + 1, lVar7 = local_158, lVar6 = lVar4, lVar4 == lVar5)) break;
    }
  }
  if ((lVar4 == lVar6) && (local_15c == 0)) {
    lVar6 = fptr->Fptr->datastart + -0xb40;
    if (lVar6 < lVar7) {
      lVar6 = lVar7;
    }
    ffmbyt(fptr,lVar6,0,&local_15c);
    ffgbyt(fptr,0x50,local_148,&local_15c);
    iVar2 = strncmp(local_148,local_e8,0x50);
    if (iVar2 == 0 && local_15c == 0) {
      fptr->Fptr->ENDpos = lVar6;
      goto LAB_0014d2a0;
    }
  }
  bytepos = fptr->Fptr->headend;
  ffmbyt(fptr,bytepos,1,status);
  if (0x4f < local_150) {
    do {
      ffpbyt(fptr,0x50,local_88,status);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  lVar7 = fptr->Fptr->datastart + -0xb40;
  if (lVar7 < bytepos) {
    lVar7 = bytepos;
  }
  ffmbyt(fptr,lVar7,0,status);
  ffpbyt(fptr,0x50,local_e8,status);
  fptr->Fptr->ENDpos = lVar7;
  if (0 < *status) {
    ffxmsg(5,"Error while writing END card (ffwend).");
  }
LAB_0014d2a0:
  return *status;
}

Assistant:

int ffwend(fitsfile *fptr,       /* I - FITS file pointer */
            int *status)         /* IO - error status     */
/*
  write the END card and following fill (space chars) in the current header
*/
{
    int ii, tstatus;
    LONGLONG endpos;
    long nspace;
    char blankkey[FLEN_CARD], endkey[FLEN_CARD], keyrec[FLEN_CARD] = "";

    if (*status > 0)
        return(*status);

    endpos = (fptr->Fptr)->headend;

    /* we assume that the HDUposition == curhdu in all cases */

    /*  calc the data starting position if not currently defined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        (fptr->Fptr)->datastart = ( endpos / 2880 + 1 ) * 2880;

    /* calculate the number of blank keyword slots in the header */
    nspace = (long) (( (fptr->Fptr)->datastart - endpos ) / 80);

    /* construct a blank and END keyword (80 spaces )  */
    strcpy(blankkey, "                                        ");
    strcat(blankkey, "                                        ");
    strcpy(endkey, "END                                     ");
    strcat(endkey, "                                        ");
  
    /* check if header is already correctly terminated with END and fill */
    tstatus=0;
    ffmbyt(fptr, endpos, REPORT_EOF, &tstatus); /* move to header end */
    for (ii=0; ii < nspace; ii++)
    {
        ffgbyt(fptr, 80, keyrec, &tstatus);  /* get next keyword */
        if (tstatus) break;
        if (strncmp(keyrec, blankkey, 80) && strncmp(keyrec, endkey, 80))
            break;
    }

    if (ii == nspace && !tstatus)
    {
        /* check if the END keyword exists at the correct position */
        endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
        ffmbyt(fptr, endpos, REPORT_EOF, &tstatus);  /* move to END position */
        ffgbyt(fptr, 80, keyrec, &tstatus); /* read the END keyword */
        if ( !strncmp(keyrec, endkey, 80) && !tstatus) {

            /* store this position, for later reference */
            (fptr->Fptr)->ENDpos = endpos;

            return(*status);    /* END card was already correct */
         }
    }

    /* header was not correctly terminated, so write the END and blank fill */
    endpos = (fptr->Fptr)->headend;
    ffmbyt(fptr, endpos, IGNORE_EOF, status); /* move to header end */
    for (ii=0; ii < nspace; ii++)
        ffpbyt(fptr, 80, blankkey, status);  /* write the blank keywords */

    /*
    The END keyword must either be placed immediately after the last
    keyword that was written (as indicated by the headend value), or
    must be in the first 80 bytes of the 2880-byte FITS record immediately 
    preceeding the data unit, whichever is further in the file. The
    latter will occur if space has been reserved for more header keywords
    which have not yet been written.
    */

    endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
    ffmbyt(fptr, endpos, REPORT_EOF, status);  /* move to END position */

    ffpbyt(fptr, 80, endkey, status); /*  write the END keyword to header */
    
    /* store this position, for later reference */
    (fptr->Fptr)->ENDpos = endpos;

    if (*status > 0)
        ffpmsg("Error while writing END card (ffwend).");

    return(*status);
}